

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_encrypt(uint16_t *ciphertext,uint16_t *plaintext,uint16_t *pubkey,uint p,uint q)

{
  uint16_t *a;
  uint16_t *out;
  ulong uVar1;
  ulong factor1;
  
  factor1 = (ulong)p;
  a = (uint16_t *)safemalloc(factor1,2,0);
  if (p != 0) {
    uVar1 = 0;
    do {
      a[uVar1] = (plaintext[uVar1] >> 1) * ((ushort)q - 3) + plaintext[uVar1];
      uVar1 = uVar1 + 1;
    } while (factor1 != uVar1);
  }
  out = (uint16_t *)safemalloc(factor1,2,0);
  ntru_ring_multiply(out,a,pubkey,p,q);
  ntru_round3(ciphertext,out,p,q);
  if (p != 0) {
    uVar1 = 0;
    do {
      ciphertext[uVar1] =
           ((ushort)((uint)(int)(short)ciphertext[uVar1] >> 0xf) & (ushort)q) + ciphertext[uVar1];
      uVar1 = uVar1 + 1;
    } while (factor1 != uVar1);
  }
  smemclr(a,factor1 * 2);
  safefree(a);
  smemclr(out,factor1 * 2);
  safefree(out);
  return;
}

Assistant:

void ntru_encrypt(uint16_t *ciphertext, const uint16_t *plaintext,
                  uint16_t *pubkey, unsigned p, unsigned q)
{
    uint16_t *r_q = snewn(p, uint16_t);
    ntru_expand(r_q, plaintext, p, q);

    uint16_t *unrounded = snewn(p, uint16_t);
    ntru_ring_multiply(unrounded, r_q, pubkey, p, q);

    ntru_round3(ciphertext, unrounded, p, q);
    ntru_normalise(ciphertext, ciphertext, p, q);

    ring_free(r_q, p);
    ring_free(unrounded, p);
}